

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O3

void __thiscall
cmFindPackageCommand::AddFindDefinition(cmFindPackageCommand *this,string *var,string_view value)

{
  cmValue cVar1;
  mapped_type *pmVar2;
  
  cVar1 = cmMakefile::GetDefinition((this->super_cmFindCommon).Makefile,var);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFindPackageCommand::OriginalDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFindPackageCommand::OriginalDef>_>_>
           ::operator[](&this->OriginalDefs,var);
  if (cVar1.Value == (string *)0x0) {
    pmVar2->exists = false;
  }
  else {
    pmVar2->exists = true;
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFindPackageCommand::OriginalDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFindPackageCommand::OriginalDef>_>_>
             ::operator[](&this->OriginalDefs,var);
    std::__cxx11::string::_M_assign((string *)&pmVar2->value);
  }
  cmMakefile::AddDefinition((this->super_cmFindCommon).Makefile,var,value);
  return;
}

Assistant:

void cmFindPackageCommand::AddFindDefinition(const std::string& var,
                                             const cm::string_view value)
{
  if (cmValue old = this->Makefile->GetDefinition(var)) {
    this->OriginalDefs[var].exists = true;
    this->OriginalDefs[var].value = *old;
  } else {
    this->OriginalDefs[var].exists = false;
  }
  this->Makefile->AddDefinition(var, value);
}